

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  uint uVar1;
  int local_e4;
  uint local_e0;
  int j;
  int i;
  int bits;
  secp256k1_scalar gnb;
  secp256k1_ge_storage adds;
  secp256k1_ge add;
  secp256k1_scalar *gn_local;
  secp256k1_gej *r_local;
  secp256k1_ecmult_gen_context *ctx_local;
  
  memset(gnb.d + 3,0,0x40);
  memcpy(r,&ctx->initial,0x80);
  secp256k1_scalar_add((secp256k1_scalar *)&i,gn,&ctx->blind);
  for (local_e4 = 0; local_e4 < 0x40; local_e4 = local_e4 + 1) {
    uVar1 = secp256k1_scalar_get_bits((secp256k1_scalar *)&i,local_e4 << 2,4);
    for (local_e0 = 0; (int)local_e0 < 0x10; local_e0 = local_e0 + 1) {
      secp256k1_ge_storage_cmov
                ((secp256k1_ge_storage *)(gnb.d + 3),(*ctx->prec)[local_e4] + (int)local_e0,
                 (uint)(local_e0 == uVar1));
    }
    secp256k1_ge_from_storage((secp256k1_ge *)(adds.y.n + 3),(secp256k1_ge_storage *)(gnb.d + 3));
    secp256k1_gej_add_ge(r,r,(secp256k1_ge *)(adds.y.n + 3));
  }
  secp256k1_ge_clear((secp256k1_ge *)(adds.y.n + 3));
  secp256k1_scalar_clear((secp256k1_scalar *)&i);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < ECMULT_GEN_PREC_N; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * ECMULT_GEN_PREC_B, ECMULT_GEN_PREC_B);
        for (i = 0; i < ECMULT_GEN_PREC_G; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}